

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fttrigon.c
# Opt level: O0

FT_Fixed FT_Vector_Length(FT_Vector *vec)

{
  byte bVar1;
  FT_Fixed FVar2;
  FT_Vector *local_40;
  FT_Vector *local_38;
  undefined1 local_30 [8];
  FT_Vector v;
  FT_Int shift;
  FT_Vector *vec_local;
  
  if (vec == (FT_Vector *)0x0) {
    vec_local = (FT_Vector *)0x0;
  }
  else {
    local_40 = (FT_Vector *)vec->x;
    local_38 = (FT_Vector *)vec->y;
    if (local_40 == (FT_Vector *)0x0) {
      if ((long)local_38 < 0) {
        local_38 = (FT_Vector *)-(long)local_38;
      }
      vec_local = local_38;
    }
    else if (local_38 == (FT_Vector *)0x0) {
      if ((long)local_40 < 0) {
        local_40 = (FT_Vector *)-(long)local_40;
      }
      vec_local = local_40;
    }
    else {
      local_30 = (undefined1  [8])local_40;
      v.x = (FT_Pos)local_38;
      v.y._4_4_ = ft_trig_prenorm((FT_Vector *)local_30);
      ft_trig_pseudo_polarize((FT_Vector *)local_30);
      FVar2 = ft_trig_downscale((FT_Fixed)local_30);
      bVar1 = (byte)v.y._4_4_;
      if (v.y._4_4_ < 1) {
        vec_local = (FT_Vector *)(ulong)(uint)((int)FVar2 << (-bVar1 & 0x1f));
      }
      else {
        vec_local = (FT_Vector *)(FVar2 + (1L << (bVar1 - 1 & 0x3f)) >> (bVar1 & 0x3f));
      }
    }
  }
  return (FT_Fixed)vec_local;
}

Assistant:

FT_EXPORT_DEF( FT_Fixed )
  FT_Vector_Length( FT_Vector*  vec )
  {
    FT_Int     shift;
    FT_Vector  v;


    if ( !vec )
      return 0;

    v = *vec;

    /* handle trivial cases */
    if ( v.x == 0 )
    {
      return FT_ABS( v.y );
    }
    else if ( v.y == 0 )
    {
      return FT_ABS( v.x );
    }

    /* general case */
    shift = ft_trig_prenorm( &v );
    ft_trig_pseudo_polarize( &v );

    v.x = ft_trig_downscale( v.x );

    if ( shift > 0 )
      return ( v.x + ( 1L << ( shift - 1 ) ) ) >> shift;

    return (FT_Fixed)( (FT_UInt32)v.x << -shift );
  }